

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastcgi_api.cpp
# Opt level: O0

void __thiscall cppcms::impl::cgi::fastcgi::add_value(fastcgi *this,string *value)

{
  uint uVar1;
  uint32_t uVar2;
  ulong uVar3;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> *this_00;
  vector<char,_std::allocator<char>_> *in_RSI;
  char *in_RDI;
  char *p;
  uint32_t size;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  char *__last;
  undefined4 in_stack_ffffffffffffffec;
  const_iterator __position;
  
  __position._M_current = in_RDI;
  uVar3 = std::__cxx11::string::size();
  if (uVar3 < 0x80) {
    std::__cxx11::string::size();
    std::vector<char,_std::allocator<char>_>::push_back
              (in_stack_ffffffffffffffb0,(value_type_conflict *)in_stack_ffffffffffffffa8);
  }
  else {
    uVar1 = std::__cxx11::string::size();
    uVar2 = htonl(uVar1 | 0x80000000);
    __last = &stack0xffffffffffffffe8;
    this_00 = (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> *)
              (in_RDI + 0x140);
    std::vector<char,_std::allocator<char>_>::end(in_stack_ffffffffffffffa8);
    __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
    __normal_iterator<char*>
              (this_00,(__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> *)
                       in_stack_ffffffffffffffa8);
    std::vector<char,std::allocator<char>>::insert<char*,void>
              (in_RSI,__position,(char *)CONCAT44(in_stack_ffffffffffffffec,uVar2),__last);
  }
  return;
}

Assistant:

void add_value(std::string const &value)
		{
			if(value.size() <128) {
				body_.push_back(char(value.size()));
			}
			else {
				uint32_t size=value.size();
				size |= 0x80000000u;
				size=htonl(size);
				char *p=(char*)&size;
				body_.insert(body_.end(),p,p+sizeof(size));
			}
		}